

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O2

void __thiscall gutil::Properties::save(Properties *this,char *name,char *comment)

{
  ofstream out;
  
  std::ofstream::ofstream(&out);
  std::ios::exceptions((int)&out + (int)*(undefined8 *)(_out + -0x18));
  std::ofstream::open((char *)&out,(_Ios_Openmode)name);
  save(this,(ostream *)&out,comment);
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void Properties::save(const char *name, const char *comment) const
{
  std::ofstream out;

  try
  {
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
    out.open(name);

    save(out, comment);

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw IOException(ex.what());
  }
}